

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.h
# Opt level: O1

bool __thiscall positionTy::isFullyValid(positionTy *this)

{
  bool bVar1;
  
  if (((!NAN(this->_head)) && (!NAN(this->_pitch))) && (!NAN(this->_roll))) {
    bVar1 = isNormal(this,false);
    return bVar1;
  }
  return false;
}

Assistant:

inline double heading() const { return _head; }